

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O2

QModelIndex * __thiscall
TreeModel::findByBase(QModelIndex *__return_storage_ptr__,TreeModel *this,UINT32 base)

{
  bool bVar1;
  UINT32 UVar2;
  int iVar3;
  TreeModel *this_00;
  TreeModel *pTVar4;
  int iVar5;
  QModelIndex parentIndex;
  QModelIndex currentIndex;
  int local_c8;
  int iStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  TreeItem *local_b8;
  int local_a4;
  QModelIndex *local_a0;
  TreeModel *local_98;
  undefined1 local_90 [24];
  undefined1 local_78 [16];
  TreeItem *pTStack_68;
  QArrayDataPointer<char> local_60;
  QArrayDataPointer<char> local_48;
  
  local_90._0_8_ = 0xffffffffffffffff;
  local_90._8_8_ = 0;
  local_90._16_8_ = (TreeItem *)0x0;
  local_a0 = __return_storage_ptr__;
  (**(code **)(*(long *)this + 0x60))(&local_c8,this,0,0,(TreeModel *)local_90);
  local_98 = this;
LAB_001680ec:
  pTVar4 = local_98;
  local_a4 = (**(code **)(*(long *)local_98 + 0x78))(local_98,&local_c8);
  if (local_a4 < 1) {
    local_a4 = 0;
  }
  iVar3 = 0;
  do {
    if (local_a4 == iVar3) {
      local_78._0_8_ = (Data *)0xffffffffffffffff;
      local_78._8_8_ = (char *)0x0;
      pTStack_68 = (TreeItem *)0x0;
      (**(code **)(*(long *)pTVar4 + 0x60))(local_90,pTVar4,0,0);
      if ((((local_90._0_4_ == local_c8) && (local_90._8_8_ == CONCAT44(uStack_bc,uStack_c0))) &&
          (local_90._4_4_ == iStack_c4)) && ((TreeItem *)local_90._16_8_ == local_b8)) {
        local_a0->r = -1;
        local_a0->c = -1;
        local_a0->i = 0;
        local_a0->m = (QAbstractItemModel *)0x0;
      }
      else {
        local_a0->m = (QAbstractItemModel *)local_b8;
        local_a0->r = local_c8;
        local_a0->c = iStack_c4;
        local_a0->i = CONCAT44(uStack_bc,uStack_c0);
      }
      return local_a0;
    }
    (*(code *)(local_b8->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>.
              _M_impl._M_node.super__List_node_base._M_next[6]._M_next)
              ((TreeModel *)local_90,local_b8,iVar3,0,&local_c8);
    this_00 = (TreeModel *)local_90;
    UVar2 = TreeModel::base(pTVar4,(QModelIndex *)local_90);
    header((QByteArray *)local_78,this_00,(QModelIndex *)local_90);
    iVar5 = (int)pTStack_68;
    body((QByteArray *)&local_48,this_00,(QModelIndex *)local_90);
    iVar5 = iVar5 + (int)local_48.size;
    tail((QByteArray *)&local_60,this_00,(QModelIndex *)local_90);
    iVar5 = iVar5 + (int)local_60.size;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
    pTVar4 = (TreeModel *)local_78;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)pTVar4);
    bVar1 = compressed(pTVar4,(QModelIndex *)local_90);
    if (bVar1) {
      bVar1 = compressed(pTVar4,(QModelIndex *)local_90);
      if (bVar1) {
        pTVar4 = (TreeModel *)local_78;
        QModelIndex::parent((QModelIndex *)local_78,(QModelIndex *)local_90);
        bVar1 = compressed(pTVar4,(QModelIndex *)local_78);
        if ((UVar2 <= base) && (!bVar1)) goto LAB_001681d0;
      }
    }
    else if (UVar2 <= base) {
LAB_001681d0:
      if (base < UVar2 + iVar5) break;
    }
    iVar3 = iVar3 + 1;
    pTVar4 = local_98;
  } while( true );
  local_b8 = (TreeItem *)local_90._16_8_;
  local_c8 = local_90._0_4_;
  iStack_c4 = local_90._4_4_;
  uStack_c0 = local_90._8_4_;
  uStack_bc = local_90._12_4_;
  goto LAB_001680ec;
}

Assistant:

UModelIndex TreeModel::findByBase(UINT32 base) const
{
    UModelIndex parentIndex = index(0,0);
    
goDeeper:
    int n = rowCount(parentIndex);
    for (int i = 0; i < n; i++) {
        UModelIndex currentIndex = parentIndex.model()->index(i, 0, parentIndex);
        
        UINT32 currentBase = this->base(currentIndex);
        UINT32 fullSize = (UINT32)(header(currentIndex).size() + body(currentIndex).size() + tail(currentIndex).size());
        if ((compressed(currentIndex) == false || (compressed(currentIndex) == true && compressed(currentIndex.parent()) == false)) // Base is meaningful only for true uncompressed items
            && currentBase <= base && base < currentBase + fullSize) { // Base must be in range [currentBase, currentBase + fullSize)
            // Found a better candidate
            parentIndex = currentIndex;
            goto goDeeper;
        }
    }
    
    return (parentIndex == index(0, 0) ? UModelIndex() : parentIndex);
}